

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_enum.cc
# Opt level: O0

char * i2s_ASN1_ENUMERATED_TABLE(X509V3_EXT_METHOD *meth,ASN1_ENUMERATED *aint)

{
  long lVar1;
  char *pcVar2;
  int *local_38;
  ENUMERATED_NAMES *enam;
  long strval;
  ASN1_ENUMERATED *e;
  void *ext_local;
  X509V3_EXT_METHOD *method_local;
  
  lVar1 = ASN1_ENUMERATED_get(aint);
  local_38 = (int *)meth->usr_data;
  while( true ) {
    if (*(long *)(local_38 + 2) == 0) {
      pcVar2 = i2s_ASN1_ENUMERATED(meth,aint);
      return pcVar2;
    }
    if (lVar1 == *local_38) break;
    local_38 = local_38 + 6;
  }
  pcVar2 = OPENSSL_strdup(*(char **)(local_38 + 2));
  return pcVar2;
}

Assistant:

static char *i2s_ASN1_ENUMERATED_TABLE(const X509V3_EXT_METHOD *method,
                                       void *ext) {
  const ASN1_ENUMERATED *e = reinterpret_cast<const ASN1_ENUMERATED *>(ext);
  long strval = ASN1_ENUMERATED_get(e);
  for (const ENUMERATED_NAMES *enam =
           reinterpret_cast<const ENUMERATED_NAMES *>(method->usr_data);
       enam->lname; enam++) {
    if (strval == enam->bitnum) {
      return OPENSSL_strdup(enam->lname);
    }
  }
  return i2s_ASN1_ENUMERATED(method, e);
}